

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_delimited.pb.cc
# Opt level: O3

void editions_unittest::TestDelimited::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  MessageLite *pMVar2;
  MessageLite *pMVar3;
  ulong uVar4;
  _func_int **pp_Var5;
  void *pvVar6;
  Arena *arena;
  
  arena = (Arena *)(to_msg->_internal_metadata_).ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  if (from_msg != to_msg) {
    uVar1 = (uint)from_msg[2]._internal_metadata_.ptr_;
    if ((uVar1 & 0x3f) == 0) goto LAB_00cd0a05;
    if ((uVar1 & 1) != 0) {
      pMVar2 = (MessageLite *)from_msg[3]._vptr_MessageLite;
      if (pMVar2 == (MessageLite *)0x0) goto LAB_00cd0a6b;
      if ((MessageLite *)to_msg[3]._vptr_MessageLite == (MessageLite *)0x0) {
        pp_Var5 = (_func_int **)
                  google::protobuf::Arena::
                  CopyConstruct<editions_unittest::TestDelimited_LengthPrefixed>(arena,pMVar2);
        to_msg[3]._vptr_MessageLite = pp_Var5;
      }
      else {
        TestDelimited_LengthPrefixed::MergeImpl((MessageLite *)to_msg[3]._vptr_MessageLite,pMVar2);
      }
    }
    if ((uVar1 & 2) != 0) {
      pMVar2 = (MessageLite *)from_msg[3]._internal_metadata_.ptr_;
      if (pMVar2 == (MessageLite *)0x0) goto LAB_00cd0a75;
      pMVar3 = (MessageLite *)to_msg[3]._internal_metadata_.ptr_;
      if (pMVar3 == (MessageLite *)0x0) {
        pvVar6 = google::protobuf::Arena::CopyConstruct<editions_unittest::TestDelimited>
                           (arena,pMVar2);
        to_msg[3]._internal_metadata_.ptr_ = (intptr_t)pvVar6;
      }
      else {
        MergeImpl(pMVar3,pMVar2);
      }
    }
    if ((uVar1 & 4) != 0) {
      pMVar2 = (MessageLite *)from_msg[4]._vptr_MessageLite;
      if (pMVar2 == (MessageLite *)0x0) goto LAB_00cd0a7f;
      if ((MessageLite *)to_msg[4]._vptr_MessageLite == (MessageLite *)0x0) {
        pp_Var5 = (_func_int **)
                  google::protobuf::Arena::CopyConstruct<editions_unittest::TestDelimited_GroupLike>
                            (arena,pMVar2);
        to_msg[4]._vptr_MessageLite = pp_Var5;
      }
      else {
        TestDelimited_GroupLike::MergeImpl((MessageLite *)to_msg[4]._vptr_MessageLite,pMVar2);
      }
    }
    if ((uVar1 & 8) != 0) {
      pMVar2 = (MessageLite *)from_msg[4]._internal_metadata_.ptr_;
      if (pMVar2 == (MessageLite *)0x0) goto LAB_00cd0a89;
      pMVar3 = (MessageLite *)to_msg[4]._internal_metadata_.ptr_;
      if (pMVar3 == (MessageLite *)0x0) {
        pvVar6 = google::protobuf::Arena::CopyConstruct<editions_unittest::TestDelimited_GroupLike>
                           (arena,pMVar2);
        to_msg[4]._internal_metadata_.ptr_ = (intptr_t)pvVar6;
      }
      else {
        TestDelimited_GroupLike::MergeImpl(pMVar3,pMVar2);
      }
    }
    if ((uVar1 & 0x10) != 0) {
      pMVar2 = (MessageLite *)from_msg[5]._vptr_MessageLite;
      if (pMVar2 == (MessageLite *)0x0) goto LAB_00cd0a93;
      if ((MessageLite *)to_msg[5]._vptr_MessageLite == (MessageLite *)0x0) {
        pp_Var5 = (_func_int **)
                  google::protobuf::Arena::CopyConstruct<editions_unittest::NotGroupLikeScope>
                            (arena,pMVar2);
        to_msg[5]._vptr_MessageLite = pp_Var5;
      }
      else {
        NotGroupLikeScope::MergeImpl((MessageLite *)to_msg[5]._vptr_MessageLite,pMVar2);
      }
    }
    if ((uVar1 & 0x20) != 0) {
      pMVar2 = (MessageLite *)from_msg[5]._internal_metadata_.ptr_;
      if (pMVar2 == (MessageLite *)0x0) goto LAB_00cd0a9d;
      pMVar3 = (MessageLite *)to_msg[5]._internal_metadata_.ptr_;
      if (pMVar3 == (MessageLite *)0x0) {
        pvVar6 = google::protobuf::Arena::CopyConstruct<editions_unittest::MessageImport>
                           (arena,pMVar2);
        to_msg[5]._internal_metadata_.ptr_ = (intptr_t)pvVar6;
      }
      else {
        MessageImport::MergeImpl(pMVar3,pMVar2);
      }
    }
LAB_00cd0a05:
    *(uint *)&to_msg[2]._internal_metadata_.ptr_ = (uint)to_msg[2]._internal_metadata_.ptr_ | uVar1;
    google::protobuf::internal::ExtensionSet::MergeFrom
              ((ExtensionSet *)(to_msg + 1),(MessageLite *)_TestDelimited_default_instance_,
               (ExtensionSet *)(from_msg + 1));
    uVar4 = (from_msg->_internal_metadata_).ptr_;
    if ((uVar4 & 1) == 0) {
      return;
    }
    google::protobuf::internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
              (&to_msg->_internal_metadata_,(UnknownFieldSet *)((uVar4 & 0xfffffffffffffffe) + 8));
    return;
  }
  MergeImpl();
LAB_00cd0a6b:
  MergeImpl((TestDelimited *)&stack0xffffffffffffffd0);
LAB_00cd0a75:
  MergeImpl((TestDelimited *)&stack0xffffffffffffffd0);
LAB_00cd0a7f:
  MergeImpl((TestDelimited *)&stack0xffffffffffffffd0);
LAB_00cd0a89:
  MergeImpl((TestDelimited *)&stack0xffffffffffffffd0);
LAB_00cd0a93:
  MergeImpl((TestDelimited *)&stack0xffffffffffffffd0);
LAB_00cd0a9d:
  MergeImpl((TestDelimited *)&stack0xffffffffffffffd0);
}

Assistant:

void TestDelimited::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestDelimited*>(&to_msg);
  auto& from = static_cast<const TestDelimited&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:editions_unittest.TestDelimited)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000003fu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      ABSL_DCHECK(from._impl_.lengthprefixed_ != nullptr);
      if (_this->_impl_.lengthprefixed_ == nullptr) {
        _this->_impl_.lengthprefixed_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.lengthprefixed_);
      } else {
        _this->_impl_.lengthprefixed_->MergeFrom(*from._impl_.lengthprefixed_);
      }
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      ABSL_DCHECK(from._impl_.nested_ != nullptr);
      if (_this->_impl_.nested_ == nullptr) {
        _this->_impl_.nested_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.nested_);
      } else {
        _this->_impl_.nested_->MergeFrom(*from._impl_.nested_);
      }
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      ABSL_DCHECK(from._impl_.grouplike_ != nullptr);
      if (_this->_impl_.grouplike_ == nullptr) {
        _this->_impl_.grouplike_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.grouplike_);
      } else {
        _this->_impl_.grouplike_->MergeFrom(*from._impl_.grouplike_);
      }
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      ABSL_DCHECK(from._impl_.notgrouplike_ != nullptr);
      if (_this->_impl_.notgrouplike_ == nullptr) {
        _this->_impl_.notgrouplike_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.notgrouplike_);
      } else {
        _this->_impl_.notgrouplike_->MergeFrom(*from._impl_.notgrouplike_);
      }
    }
    if ((cached_has_bits & 0x00000010u) != 0) {
      ABSL_DCHECK(from._impl_.notgrouplikescope_ != nullptr);
      if (_this->_impl_.notgrouplikescope_ == nullptr) {
        _this->_impl_.notgrouplikescope_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.notgrouplikescope_);
      } else {
        _this->_impl_.notgrouplikescope_->MergeFrom(*from._impl_.notgrouplikescope_);
      }
    }
    if ((cached_has_bits & 0x00000020u) != 0) {
      ABSL_DCHECK(from._impl_.messageimport_ != nullptr);
      if (_this->_impl_.messageimport_ == nullptr) {
        _this->_impl_.messageimport_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.messageimport_);
      } else {
        _this->_impl_.messageimport_->MergeFrom(*from._impl_.messageimport_);
      }
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_impl_._extensions_.MergeFrom(&default_instance(), from._impl_._extensions_);
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}